

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-walker-impl.h
# Opt level: O3

void wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::scan
               (ReconstructStringifyWalker *self,Expression **currp)

{
  iterator *piVar1;
  _Elt_pointer ppEVar2;
  Index IVar3;
  Expression ***pppEVar4;
  Index IVar5;
  Index index;
  AbstractChildIterator<wasm::ValueChildIterator> local_78;
  Expression *local_38;
  Expression *curr;
  
  local_38 = *currp;
  if (((ulong)local_38->_id < 0x36) &&
     ((0x3000000000000eU >> ((ulong)local_38->_id & 0x3f) & 1) != 0)) {
    ppEVar2 = (self->super_StringifyWalker<wasm::ReconstructStringifyWalker>).controlFlowQueue.c.
              super__Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (ppEVar2 ==
        *(_Elt_pointer *)
         ((long)&(self->super_StringifyWalker<wasm::ReconstructStringifyWalker>).controlFlowQueue.c.
                 super__Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                 super__Deque_impl_data._M_finish + 0x10) + -1) {
      std::deque<wasm::Expression*,std::allocator<wasm::Expression*>>::
      _M_push_back_aux<wasm::Expression*const&>
                ((deque<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                 &(self->super_StringifyWalker<wasm::ReconstructStringifyWalker>).controlFlowQueue,
                 &local_38);
    }
    else {
      *ppEVar2 = local_38;
      piVar1 = &(self->super_StringifyWalker<wasm::ReconstructStringifyWalker>).controlFlowQueue.c.
                super__Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                *)self,doVisitExpression,currp);
    AbstractChildIterator<wasm::ValueChildIterator>::AbstractChildIterator(&local_78,local_38);
    IVar5 = (int)((ulong)((long)local_78.children.flexible.
                                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_78.children.flexible.
                               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) +
            (int)local_78.children.usedFixed;
    if (IVar5 != 0) {
      index = 0;
      do {
        IVar3 = AbstractChildIterator<wasm::ValueChildIterator>::mapIndex(&local_78,index);
        pppEVar4 = local_78.children.flexible.
                   super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                   _M_impl.super__Vector_impl_data._M_start + ((ulong)IVar3 - 4);
        if (IVar3 < 4) {
          pppEVar4 = local_78.children.fixed._M_elems + IVar3;
        }
        PostWalker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
        ::scan(self,*pppEVar4);
        index = index + 1;
      } while (IVar5 != index);
    }
    if (local_78.children.flexible.
        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.children.flexible.
                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.children.flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.children.flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  PostWalker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
  ::scan(self,currp);
  return;
}

Assistant:

inline void StringifyWalker<SubType>::scan(SubType* self, Expression** currp) {
  Expression* curr = *currp;
  if (Properties::isControlFlowStructure(curr)) {
    self->controlFlowQueue.push(curr);
    DBG(std::cerr << "controlFlowQueue.push: " << ShallowExpression{curr}
                  << ", " << curr << "\n");
    self->pushTask(doVisitExpression, currp);
    // The if-condition is a value child consumed by the if control flow, which
    // makes the if-condition a true sibling rather than part of its contents in
    // the binary format
    for (auto*& child : ValueChildIterator(curr)) {
      Super::scan(self, &child);
    }
  } else {
    Super::scan(self, currp);
  }
}